

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O3

GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Resolve(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          *__return_storage_ptr__,
         GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
         *this,GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *baseuri,CrtAllocator *allocator)

{
  int iVar1;
  size_t sVar2;
  Ch *pCVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  __return_storage_ptr__->frag_ = (Ch *)0x0;
  __return_storage_ptr__->allocator_ = (CrtAllocator *)0x0;
  __return_storage_ptr__->path_ = (Ch *)0x0;
  __return_storage_ptr__->query_ = (Ch *)0x0;
  __return_storage_ptr__->scheme_ = (Ch *)0x0;
  __return_storage_ptr__->auth_ = (Ch *)0x0;
  __return_storage_ptr__->uri_ = (Ch *)0x0;
  __return_storage_ptr__->base_ = (Ch *)0x0;
  __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
  __return_storage_ptr__->allocator_ = allocator;
  if (this->uri_ == (char *)0x0) {
    iVar7 = 1;
  }
  else {
    sVar2 = strlen(this->uri_);
    iVar7 = (int)sVar2 + 1;
  }
  if (baseuri->uri_ == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    sVar2 = strlen(baseuri->uri_);
    iVar1 = (int)sVar2;
  }
  Allocate(__return_storage_ptr__,(ulong)(uint)(iVar7 + iVar1));
  pcVar5 = this->scheme_;
  if ((pcVar5 != (char *)0x0) && (sVar2 = strlen(pcVar5), (int)sVar2 != 0)) {
    pCVar3 = __return_storage_ptr__->scheme_;
    sVar2 = strlen(pcVar5);
    pCVar3 = CopyPart(this,pCVar3,pcVar5,sVar2 & 0xffffffff);
    __return_storage_ptr__->auth_ = pCVar3;
    pcVar5 = this->auth_;
    if (pcVar5 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar5);
      sVar4 = sVar2 & 0xffffffff;
    }
LAB_0013b4bd:
    pCVar3 = CopyPart(this,pCVar3,pcVar5,sVar4);
    __return_storage_ptr__->path_ = pCVar3;
    pcVar5 = this->path_;
    if (pcVar5 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar5);
      sVar4 = sVar2 & 0xffffffff;
    }
    pCVar3 = CopyPart(this,pCVar3,pcVar5,sVar4);
    __return_storage_ptr__->query_ = pCVar3;
    pcVar5 = this->query_;
    if (pcVar5 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar5);
      sVar4 = sVar2 & 0xffffffff;
    }
    pCVar3 = CopyPart(this,pCVar3,pcVar5,sVar4);
    __return_storage_ptr__->frag_ = pCVar3;
    RemoveDotSegments(__return_storage_ptr__);
    goto LAB_0013b6f3;
  }
  pCVar3 = __return_storage_ptr__->scheme_;
  pcVar5 = baseuri->scheme_;
  if (pcVar5 == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar2 = strlen(pcVar5);
    sVar4 = sVar2 & 0xffffffff;
  }
  pCVar3 = CopyPart(this,pCVar3,pcVar5,sVar4);
  __return_storage_ptr__->auth_ = pCVar3;
  pcVar5 = this->auth_;
  if (pcVar5 != (char *)0x0) {
    sVar2 = strlen(pcVar5);
    sVar4 = sVar2 & 0xffffffff;
    if (sVar4 != 0) goto LAB_0013b4bd;
  }
  pcVar5 = baseuri->auth_;
  if (pcVar5 == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar2 = strlen(pcVar5);
    sVar4 = sVar2 & 0xffffffff;
  }
  pCVar3 = CopyPart(this,pCVar3,pcVar5,sVar4);
  __return_storage_ptr__->path_ = pCVar3;
  pcVar5 = this->path_;
  if ((pcVar5 == (char *)0x0) || (sVar2 = strlen(pcVar5), (int)sVar2 == 0)) {
    pcVar5 = baseuri->path_;
    if (pcVar5 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar5);
      sVar4 = sVar2 & 0xffffffff;
    }
    pCVar3 = CopyPart(this,pCVar3,pcVar5,sVar4);
    __return_storage_ptr__->query_ = pCVar3;
    pcVar5 = this->query_;
    if (pcVar5 != (char *)0x0) {
      sVar2 = strlen(pcVar5);
      sVar4 = sVar2 & 0xffffffff;
      if (sVar4 != 0) goto LAB_0013b6ea;
    }
    pcVar5 = baseuri->query_;
    if (pcVar5 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar5);
      sVar4 = sVar2 & 0xffffffff;
    }
  }
  else {
    if (*pcVar5 == '/') {
      if (pCVar3 == (Ch *)0x0) {
        __assert_fail("to != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/uri.h"
                      ,400,
                      "Ch *rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<>>>::CopyPart(Ch *, Ch *, std::size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                     );
      }
      sVar2 = strlen(pcVar5);
      uVar8 = sVar2 & 0xffffffff;
      memcpy(pCVar3,pcVar5,uVar8);
      pCVar3[uVar8] = '\0';
      __return_storage_ptr__->query_ = pCVar3 + uVar8 + 1;
      RemoveDotSegments(__return_storage_ptr__);
    }
    else {
      if (((baseuri->auth_ == (char *)0x0) || (sVar2 = strlen(baseuri->auth_), (int)sVar2 == 0)) ||
         ((baseuri->path_ != (char *)0x0 && (sVar2 = strlen(baseuri->path_), (int)sVar2 != 0)))) {
        lVar6 = 0;
      }
      else {
        *pCVar3 = '/';
        lVar6 = 1;
      }
      pcVar5 = baseuri->path_;
      if (pcVar5 != (char *)0x0) {
        sVar2 = strlen(pcVar5);
        for (uVar8 = sVar2 & 0xffffffff; uVar8 != 0; uVar8 = uVar8 - 1) {
          if (pcVar5[uVar8 - 1] == '/') goto LAB_0013b679;
        }
      }
      uVar8 = 0;
LAB_0013b679:
      memcpy(__return_storage_ptr__->path_ + lVar6,pcVar5,uVar8);
      pCVar3 = __return_storage_ptr__->path_;
      pcVar5 = this->path_;
      if (pcVar5 == (char *)0x0) {
        sVar4 = 0;
      }
      else {
        sVar2 = strlen(pcVar5);
        sVar4 = sVar2 & 0xffffffff;
      }
      pCVar3 = CopyPart(this,pCVar3 + uVar8 + lVar6,pcVar5,sVar4);
      __return_storage_ptr__->query_ = pCVar3;
      RemoveDotSegments(__return_storage_ptr__);
    }
    pCVar3 = __return_storage_ptr__->query_;
    pcVar5 = this->query_;
    if (pcVar5 == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar2 = strlen(pcVar5);
      sVar4 = sVar2 & 0xffffffff;
    }
  }
LAB_0013b6ea:
  pCVar3 = CopyPart(this,pCVar3,pcVar5,sVar4);
  __return_storage_ptr__->frag_ = pCVar3;
LAB_0013b6f3:
  pCVar3 = __return_storage_ptr__->frag_;
  pcVar5 = this->frag_;
  if (pcVar5 == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar2 = strlen(pcVar5);
    sVar4 = sVar2 & 0xffffffff;
  }
  pCVar3 = CopyPart(this,pCVar3,pcVar5,sVar4);
  __return_storage_ptr__->base_ = pCVar3;
  SetBase(__return_storage_ptr__);
  pcVar5 = __return_storage_ptr__->base_;
  if (pcVar5 == (char *)0x0) {
    uVar8 = 0;
  }
  else {
    sVar2 = strlen(pcVar5);
    uVar8 = sVar2 & 0xffffffff;
  }
  __return_storage_ptr__->uri_ = pcVar5 + uVar8 + 1;
  SetUri(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

GenericUri Resolve(const GenericUri& baseuri, Allocator* allocator = 0) {
        GenericUri resuri;
        resuri.allocator_ = allocator;
        // Ensure enough space for combining paths
        resuri.Allocate(GetStringLength() + baseuri.GetStringLength() + 1); // + 1 for joining slash

        if (!(GetSchemeStringLength() == 0)) {
            // Use all of this URI
            resuri.auth_ = CopyPart(resuri.scheme_, scheme_, GetSchemeStringLength());
            resuri.path_ = CopyPart(resuri.auth_, auth_, GetAuthStringLength());
            resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
            resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
            resuri.RemoveDotSegments();
        } else {
            // Use the base scheme
            resuri.auth_ = CopyPart(resuri.scheme_, baseuri.scheme_, baseuri.GetSchemeStringLength());
            if (!(GetAuthStringLength() == 0)) {
                // Use this auth, path, query
                resuri.path_ = CopyPart(resuri.auth_, auth_, GetAuthStringLength());
                resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
                resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                resuri.RemoveDotSegments();
            } else {
                // Use the base auth
                resuri.path_ = CopyPart(resuri.auth_, baseuri.auth_, baseuri.GetAuthStringLength());
                if (GetPathStringLength() == 0) {
                    // Use the base path
                    resuri.query_ = CopyPart(resuri.path_, baseuri.path_, baseuri.GetPathStringLength());
                    if (GetQueryStringLength() == 0) {
                        // Use the base query
                        resuri.frag_ = CopyPart(resuri.query_, baseuri.query_, baseuri.GetQueryStringLength());
                    } else {
                        // Use this query
                        resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                    }
                } else {
                    if (path_[0] == '/') {
                        // Absolute path - use all of this path
                        resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
                        resuri.RemoveDotSegments();
                    } else {
                        // Relative path - append this path to base path after base path's last slash
                        size_t pos = 0;
                        if (!(baseuri.GetAuthStringLength() == 0) && baseuri.GetPathStringLength() == 0) {
                            resuri.path_[pos] = '/';
                            pos++;
                        }
                        size_t lastslashpos = baseuri.GetPathStringLength();
                        while (lastslashpos > 0) {
                            if (baseuri.path_[lastslashpos - 1] == '/') break;
                            lastslashpos--;
                        }
                        std::memcpy(&resuri.path_[pos], baseuri.path_, lastslashpos * sizeof(Ch));
                        pos += lastslashpos;
                        resuri.query_ = CopyPart(&resuri.path_[pos], path_, GetPathStringLength());
                        resuri.RemoveDotSegments();
                    }
                    // Use this query
                    resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                }
            }
        }
        // Always use this frag
        resuri.base_ = CopyPart(resuri.frag_, frag_, GetFragStringLength());

        // Re-constitute base_ and uri_
        resuri.SetBase();
        resuri.uri_ = resuri.base_ + resuri.GetBaseStringLength() + 1;
        resuri.SetUri();
        return resuri;
    }